

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O2

int __thiscall
BamTools::BamAlignment::GetEndPosition(BamAlignment *this,bool usePadded,bool closedInterval)

{
  int iVar1;
  pointer pCVar2;
  uint uVar3;
  
  iVar1 = this->Position;
  for (pCVar2 = (this->CigarData).
                super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar2 != (this->CigarData).
                super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
                super__Vector_impl_data._M_finish; pCVar2 = pCVar2 + 1) {
    uVar3 = (byte)pCVar2->Type - 0x3d;
    if ((uVar3 < 0x1c) &&
       (((0x8030081U >> (uVar3 & 0x1f) & 1) != 0 || ((uVar3 == 0xc && (usePadded)))))) {
      iVar1 = iVar1 + pCVar2->Length;
    }
  }
  return iVar1 - (uint)closedInterval;
}

Assistant:

int BamAlignment::GetEndPosition(bool usePadded, bool closedInterval) const
{

    // initialize alignment end to starting position
    int alignEnd = Position;

    // iterate over cigar operations
    std::vector<CigarOp>::const_iterator cigarIter = CigarData.begin();
    std::vector<CigarOp>::const_iterator cigarEnd = CigarData.end();
    for (; cigarIter != cigarEnd; ++cigarIter) {
        const CigarOp& op = (*cigarIter);

        switch (op.Type) {

            // increase end position on CIGAR chars [DMXN=]
            case Constants::BAM_CIGAR_DEL_CHAR:
            case Constants::BAM_CIGAR_MATCH_CHAR:
            case Constants::BAM_CIGAR_MISMATCH_CHAR:
            case Constants::BAM_CIGAR_REFSKIP_CHAR:
            case Constants::BAM_CIGAR_SEQMATCH_CHAR:
                alignEnd += op.Length;
                break;

            // increase end position on insertion, only if @usePadded is true
            case Constants::BAM_CIGAR_INS_CHAR:
                if (usePadded) alignEnd += op.Length;
                break;

            // all other CIGAR chars do not affect end position
            default:
                break;
        }
    }

    // adjust for closedInterval, if requested
    if (closedInterval) alignEnd -= 1;

    // return result
    return alignEnd;
}